

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>>
          (String *__return_storage_ptr__,_ *this,CappedArray<char,_14UL> *params,
          FixedArray<char,_1UL> *params_1,CappedArray<char,_14UL> *params_2,
          FixedArray<char,_1UL> *params_3,CappedArray<char,_14UL> *params_4)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  size_t size;
  long local_58 [5];
  
  local_58[0] = *(long *)this;
  local_58[1] = 1;
  local_58[2] = *(undefined8 *)params_1;
  local_58[3] = 1;
  local_58[4] = *(undefined8 *)params_3;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_58 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x28);
  heapString(__return_storage_ptr__,size);
  pcVar3 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)this;
  if (sVar1 != 0) {
    memcpy(pcVar3,this + 8,sVar1);
    pcVar3 = pcVar3 + sVar1;
  }
  *pcVar3 = (char)params->currentSize;
  pcVar3 = pcVar3 + 1;
  sVar1 = *(size_t *)params_1;
  if (sVar1 != 0) {
    memcpy(pcVar3,params_1 + 8,sVar1);
    pcVar3 = pcVar3 + sVar1;
  }
  *pcVar3 = (char)params_2->currentSize;
  if (*(size_t *)params_3 != 0) {
    memcpy(pcVar3 + 1,params_3 + 8,*(size_t *)params_3);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}